

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O1

void __thiscall QTextEdit::setTextBackgroundColor(QTextEdit *this,QColor *c)

{
  long in_FS_OFFSET;
  QBrush local_60 [8];
  undefined1 *local_58;
  undefined1 *puStack_50;
  QVariant local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_58);
  QBrush::QBrush(local_60,c,SolidPattern);
  QBrush::operator_cast_to_QVariant(&local_48,local_60);
  QTextFormat::setProperty((int)(QTextFormat *)&local_58,(QVariant *)0x820);
  ::QVariant::~QVariant(&local_48);
  QBrush::~QBrush(local_60);
  QWidgetTextControl::mergeCurrentCharFormat
            (*(QWidgetTextControl **)
              (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8 +
              0x2f8),(QTextCharFormat *)&local_58);
  QTextFormat::~QTextFormat((QTextFormat *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::setTextBackgroundColor(const QColor &c)
{
    QTextCharFormat fmt;
    fmt.setBackground(QBrush(c));
    mergeCurrentCharFormat(fmt);
}